

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixStrideCaseBlockContentCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedBasicTypeCases,bool opaqueCases)

{
  MatrixOrder MVar1;
  ProgramInterface PVar2;
  TestNode *node;
  TestNode *pTVar3;
  LayoutQualifier *this;
  long lVar4;
  int iVar5;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr subStructure;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
  local_60;
  Layout layout;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_UNIFORM,0x80);
  lVar4 = 8;
  do {
    if (lVar4 == 0x38) {
      return;
    }
    MVar1 = *(MatrixOrder *)
             ((long)&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[0].name + lVar4);
    subStructure.m_ptr = parentStructure->m_ptr;
    if ((MVar1 == MATRIXORDER_LAST) || ((subStructure.m_ptr)->m_type == TYPE_INTERFACE_BLOCK)) {
      subStructure.m_state = parentStructure->m_state;
      if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (subStructure.m_state)->strongRefCount = (subStructure.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (subStructure.m_state)->weakRefCount = (subStructure.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      node = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,context->m_testCtx,
                 *(char **)((long)&generateUniformMatrixOrderCaseBlockContentCases::qualifiers[2].
                                   order + lVar4),glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
      if (MVar1 == MATRIXORDER_LAST) {
        if (extendedBasicTypeCases) {
          pTVar3 = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar3,context->m_testCtx,"types",
                     glcts::fixed_sample_locations_values + 1);
          tcu::TestNode::addChild(node,pTVar3);
          iVar5 = 0;
          generateVariableCases(context,&subStructure,(TestCaseGroup *)pTVar3,&queryTarget,1,false);
          generateMatrixVariableCases
                    (context,&subStructure,(TestCaseGroup *)pTVar3,&queryTarget,false,iVar5);
          if (opaqueCases) {
            generateOpaqueTypeCases
                      (context,&subStructure,(TestCaseGroup *)pTVar3,&queryTarget,2,false);
          }
          goto LAB_012eef8f;
        }
LAB_012ef001:
        PVar2 = queryTarget.interface;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&layout,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_60);
        generateBufferBackedVariableAggregateTypeCases
                  (context,&subStructure,(TestCaseGroup *)node,PVar2,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,(string *)&layout,1);
      }
      else {
        iVar5 = 2;
        glu::Layout::Layout(&layout,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
        layout.matrixOrder = MVar1;
        this = (LayoutQualifier *)operator_new(0x38);
        ResourceDefinition::LayoutQualifier::LayoutQualifier(this,&subStructure,&layout);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&local_60,(Node *)this);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        operator=(&subStructure,&local_60);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&local_60);
        if (!extendedBasicTypeCases) goto LAB_012ef001;
        generateMatrixVariableCases
                  (context,&subStructure,(TestCaseGroup *)node,&queryTarget,true,iVar5);
LAB_012eef8f:
        pTVar3 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar3,context->m_testCtx,"aggregates",
                   glcts::fixed_sample_locations_values + 1);
        tcu::TestNode::addChild(node,pTVar3);
        PVar2 = queryTarget.interface;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&layout,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_60);
        generateBufferBackedVariableAggregateTypeCases
                  (context,&subStructure,(TestCaseGroup *)pTVar3,PVar2,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,(string *)&layout,1);
      }
      std::__cxx11::string::~string((string *)&layout);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&subStructure);
    }
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

static void generateUniformMatrixStrideCaseBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, bool extendedBasicTypeCases, bool opaqueCases)
{
	static const struct
	{
		const char*			name;
		glu::MatrixOrder	order;
	} qualifiers[] =
	{
		{ "no_qualifier",	glu::MATRIXORDER_LAST			},
		{ "row_major",		glu::MATRIXORDER_ROW_MAJOR		},
		{ "column_major",	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ProgramResourceQueryTestTarget queryTarget(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_MATRIX_STRIDE);

	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		// Add layout qualifiers only for block members
		if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST || parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK)
		{
			ResourceDefinition::Node::SharedPtr	subStructure	= parentStructure;
			tcu::TestCaseGroup* const			qualifierGroup	= new tcu::TestCaseGroup(context.getTestContext(), qualifiers[qualifierNdx].name, "");

			targetGroup->addChild(qualifierGroup);

			if (qualifiers[qualifierNdx].order != glu::MATRIXORDER_LAST)
			{
				glu::Layout layout;
				layout.matrixOrder = qualifiers[qualifierNdx].order;
				subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
			}

			if (extendedBasicTypeCases)
			{
				// .types
				// .matrix
				if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST)
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "");
					qualifierGroup->addChild(blockGroup);

					generateVariableCases(context, subStructure, blockGroup, queryTarget, 1, false);
					generateMatrixVariableCases(context, subStructure, blockGroup, queryTarget, false);
					if (opaqueCases)
						generateOpaqueTypeCases(context, subStructure, blockGroup, queryTarget, 2, false);
				}
				else
					generateMatrixVariableCases(context, subStructure, qualifierGroup, queryTarget);

				// .aggregates
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "");
					qualifierGroup->addChild(blockGroup);

					generateBufferBackedVariableAggregateTypeCases(context, subStructure, blockGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
				}
			}
			else
				generateBufferBackedVariableAggregateTypeCases(context, subStructure, qualifierGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
		}
	}
}